

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O3

void __thiscall
HookListTest_MultithreadedTest_Test::TestBody(HookListTest_MultithreadedTest_Test *this)

{
  bool bVar1;
  char *message;
  pointer pcVar2;
  char *in_R9;
  undefined1 local_78 [8];
  NewHook values [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  AssertHelper local_20;
  
  bVar1 = base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Remove
                    (&list,anon_class_1_0_00000001::__invoke);
  values[7]._0_1_ = bVar1;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    values[7]._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,std::atomic<unsigned_long>>
              ((internal *)local_78,"0","list.priv_end",(int *)(values + 7),&list.priv_end);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)(values + 7));
      if (values[0] == (NewHook)0x0) {
        message = "";
      }
      else {
        message = *(char **)values[0];
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0xf2,message);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)(values + 7));
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if ((long *)CONCAT44(values[7]._4_4_,values[7]._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(values[7]._4_4_,values[7]._0_4_) + 8))();
      }
    }
    if (values[0] != (NewHook)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)values,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values[0]);
    }
    if (local_78[0] == (internal)0x0) {
      return;
    }
    num_threads_remaining = 7;
    RunManyThreadsWithId(MultithreadedTestThreadRunner,7);
    local_20.data_._0_4_ = 0;
    local_28.data_._0_4_ =
         base::internal::HookList<void_(*)(const_void_*,_unsigned_long)>::Traverse
                   (&list,(_func_void_void_ptr_unsigned_long **)local_78,8);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)(values + 7),"0","list.Traverse(values, kHookListMaxValues + 1)",
               (int *)&local_20,(int *)&local_28);
    if ((char)values[7] == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0xfa,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if ((long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) + 8))();
      }
    }
    if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_30,local_30);
    }
    local_20.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,std::atomic<unsigned_long>>
              ((internal *)(values + 7),"0","list.priv_end",(int *)&local_20,&list.priv_end);
    if ((char)values[7] == '\0') {
      testing::Message::Message((Message *)&local_20);
      if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_30->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
                 ,0xfb,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if ((long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) + 8))();
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)(values + 7),
               (AssertionResult *)"list.Remove(kTestValue)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/malloc_hook_test.cc"
               ,0xf1,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((NewHook *)CONCAT71(local_78._1_7_,local_78[0]) != values + 1) {
      operator_delete((NewHook *)CONCAT71(local_78._1_7_,local_78[0]),(ulong)(values[1] + 1));
    }
    if ((long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_20.data_._4_4_,local_20.data_._0_4_) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST(HookListTest, MultithreadedTest) {
  ASSERT_TRUE(list.Remove(kTestValue));
  ASSERT_EQ(0, list.priv_end);

  // Run kHookListMaxValues thread, each running MultithreadedTestThread.
  // First, we need to set up the rest of the globals.
  num_threads_remaining = kHookListMaxValues;   // a global var
  RunManyThreadsWithId(&MultithreadedTestThreadRunner, num_threads_remaining);

  MallocHook::NewHook values[kHookListMaxValues + 1];
  EXPECT_EQ(0, list.Traverse(values, kHookListMaxValues + 1));
  EXPECT_EQ(0, list.priv_end);
}